

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::precisionReached(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *newpricertol)

{
  SPxOut *pSVar1;
  Real RVar2;
  char cVar3;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxViolRedCost;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolConst;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolBounds;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumViolRedCost;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_458;
  cpp_dec_float<50U,_int,_void> local_418;
  cpp_dec_float<50U,_int,_void> local_3d8;
  uint local_398 [6];
  undefined5 uStack_380;
  undefined3 uStack_37b;
  undefined5 local_378;
  undefined3 uStack_373;
  int local_370;
  undefined1 local_36c;
  undefined8 local_368;
  uint local_358 [6];
  undefined5 uStack_340;
  undefined3 uStack_33b;
  undefined5 local_338;
  undefined3 uStack_333;
  int local_330;
  undefined1 local_32c;
  undefined8 local_328;
  uint local_318 [6];
  undefined5 uStack_300;
  undefined3 uStack_2fb;
  undefined5 local_2f8;
  undefined3 uStack_2f3;
  int local_2f0;
  undefined1 local_2ec;
  undefined8 local_2e8;
  cpp_dec_float<50U,_int,_void> local_2d8;
  cpp_dec_float<50U,_int,_void> local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_3d8.fpclass = cpp_dec_float_finite;
  local_3d8.prec_elem = 10;
  local_3d8.data._M_elems[0] = 0;
  local_3d8.data._M_elems[1] = 0;
  local_3d8.data._M_elems[2] = 0;
  local_3d8.data._M_elems[3] = 0;
  local_3d8.data._M_elems[4] = 0;
  local_3d8.data._M_elems[5] = 0;
  local_3d8.data._M_elems._24_5_ = 0;
  local_3d8.data._M_elems[7]._1_3_ = 0;
  local_3d8.data._M_elems._32_5_ = 0;
  local_3d8.data._M_elems[9]._1_3_ = 0;
  local_3d8.exp = 0;
  local_3d8.neg = false;
  local_2e8._0_4_ = cpp_dec_float_finite;
  local_2e8._4_4_ = 10;
  local_318[0] = 0;
  local_318[1] = 0;
  local_318[2] = 0;
  local_318[3] = 0;
  local_318[4] = 0;
  local_318[5] = 0;
  uStack_300 = 0;
  uStack_2fb = 0;
  local_2f8 = 0;
  uStack_2f3 = 0;
  local_2f0 = 0;
  local_2ec = 0;
  local_418.fpclass = cpp_dec_float_finite;
  local_418.prec_elem = 10;
  local_418.data._M_elems[0] = 0;
  local_418.data._M_elems[1] = 0;
  local_418.data._M_elems[2] = 0;
  local_418.data._M_elems[3] = 0;
  local_418.data._M_elems[4] = 0;
  local_418.data._M_elems[5] = 0;
  local_418.data._M_elems._24_5_ = 0;
  local_418.data._M_elems[7]._1_3_ = 0;
  local_418.data._M_elems._32_5_ = 0;
  local_418.data._M_elems[9]._1_3_ = 0;
  local_418.exp = 0;
  local_418.neg = false;
  local_328._0_4_ = cpp_dec_float_finite;
  local_328._4_4_ = 10;
  local_358[0] = 0;
  local_358[1] = 0;
  local_358[2] = 0;
  local_358[3] = 0;
  local_358[4] = 0;
  local_358[5] = 0;
  uStack_340 = 0;
  uStack_33b = 0;
  local_338 = 0;
  uStack_333 = 0;
  local_330 = 0;
  local_32c = 0;
  local_458.fpclass = cpp_dec_float_finite;
  local_458.prec_elem = 10;
  local_458.data._M_elems[0] = 0;
  local_458.data._M_elems[1] = 0;
  local_458.data._M_elems[2] = 0;
  local_458.data._M_elems[3] = 0;
  local_458.data._M_elems[4] = 0;
  local_458.data._M_elems[5] = 0;
  local_458.data._M_elems._24_5_ = 0;
  local_458.data._M_elems[7]._1_3_ = 0;
  local_458.data._M_elems._32_5_ = 0;
  local_458.data._M_elems[9]._1_3_ = 0;
  local_458.exp = 0;
  local_458.neg = false;
  local_368._0_4_ = cpp_dec_float_finite;
  local_368._4_4_ = 10;
  local_398[0] = 0;
  local_398[1] = 0;
  local_398[2] = 0;
  local_398[3] = 0;
  local_398[4] = 0;
  local_398[5] = 0;
  uStack_380 = 0;
  uStack_37b = 0;
  local_378 = 0;
  uStack_373 = 0;
  local_370 = 0;
  local_36c = 0;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x72])();
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x70])(this,&local_418,local_358);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6f])(this,&local_458,local_398);
  RVar2 = Tolerances::floatingPointOpttol
                    ((this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((!NAN(RVar2)) && (local_3d8.fpclass != cpp_dec_float_NaN)) {
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 10;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems._24_5_ = 0;
    local_2d8.data._M_elems[7]._1_3_ = 0;
    local_2d8.data._M_elems._32_5_ = 0;
    local_2d8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_2d8,RVar2);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_3d8,&local_2d8);
    if ((iVar4 < 0) &&
       ((RVar2 = Tolerances::floatingPointFeastol
                           ((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr), !NAN(RVar2) && (local_418.fpclass != cpp_dec_float_NaN)))) {
      local_2d8.fpclass = cpp_dec_float_finite;
      local_2d8.prec_elem = 10;
      local_2d8.data._M_elems[0] = 0;
      local_2d8.data._M_elems[1] = 0;
      local_2d8.data._M_elems[2] = 0;
      local_2d8.data._M_elems[3] = 0;
      local_2d8.data._M_elems[4] = 0;
      local_2d8.data._M_elems[5] = 0;
      local_2d8.data._M_elems._24_5_ = 0;
      local_2d8.data._M_elems[7]._1_3_ = 0;
      local_2d8.data._M_elems._32_5_ = 0;
      local_2d8._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_2d8,RVar2);
      iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_418,&local_2d8);
      if ((iVar4 < 0) &&
         ((RVar2 = Tolerances::floatingPointFeastol
                             ((this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr), !NAN(RVar2) && (local_458.fpclass != cpp_dec_float_NaN)))) {
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 10;
        local_2d8.data._M_elems[0] = 0;
        local_2d8.data._M_elems[1] = 0;
        local_2d8.data._M_elems[2] = 0;
        local_2d8.data._M_elems[3] = 0;
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems._24_5_ = 0;
        local_2d8.data._M_elems[7]._1_3_ = 0;
        local_2d8.data._M_elems._32_5_ = 0;
        local_2d8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_2d8,RVar2);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_458,&local_2d8);
        if (iVar4 < 0) {
          return true;
        }
      }
    }
  }
  (*this->thepricer->_vptr_SPxPricer[5])(&local_68);
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems[6] = 0;
  local_298.data._M_elems[7] = 0;
  local_298.data._M_elems._32_5_ = 0;
  local_298.data._M_elems[9]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems._24_5_ = 0;
  local_2d8.data._M_elems[7]._1_3_ = 0;
  local_2d8.data._M_elems._32_5_ = 0;
  local_2d8._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_2d8,10.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_298,&local_68,&local_2d8);
  *(ulong *)((newpricertol->m_backend).data._M_elems + 8) =
       CONCAT35(local_298.data._M_elems[9]._1_3_,local_298.data._M_elems._32_5_);
  (newpricertol->m_backend).data._M_elems[4] = local_298.data._M_elems[4];
  (newpricertol->m_backend).data._M_elems[5] = local_298.data._M_elems[5];
  (newpricertol->m_backend).data._M_elems[6] = local_298.data._M_elems[6];
  (newpricertol->m_backend).data._M_elems[7] = local_298.data._M_elems[7];
  (newpricertol->m_backend).data._M_elems[0] = local_298.data._M_elems[0];
  (newpricertol->m_backend).data._M_elems[1] = local_298.data._M_elems[1];
  (newpricertol->m_backend).data._M_elems[2] = local_298.data._M_elems[2];
  (newpricertol->m_backend).data._M_elems[3] = local_298.data._M_elems[3];
  (newpricertol->m_backend).exp = local_298.exp;
  (newpricertol->m_backend).neg = local_298.neg;
  (newpricertol->m_backend).fpclass = local_298.fpclass;
  (newpricertol->m_backend).prec_elem = local_298.prec_elem;
  pSVar1 = this->spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
    local_2d8.data._M_elems[0] = pSVar1->m_verbosity;
    local_298.data._M_elems[0] = 5;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"Precision not reached: Pricer tolerance = ",
               0x2a);
    (*this->thepricer->_vptr_SPxPricer[5])(&local_a0);
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," new tolerance = ",0x11);
    local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newpricertol->m_backend).data._M_elems;
    local_d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 2);
    local_d8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 4);
    local_d8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 6);
    local_d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newpricertol->m_backend).data._M_elems + 8);
    local_d8.m_backend.exp = (newpricertol->m_backend).exp;
    local_d8.m_backend.neg = (newpricertol->m_backend).neg;
    local_d8.m_backend.fpclass = (newpricertol->m_backend).fpclass;
    local_d8.m_backend.prec_elem = (newpricertol->m_backend).prec_elem;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_d8);
    cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolRedCost= ",0x11);
    local_118.m_backend.data._M_elems[7]._1_3_ = local_3d8.data._M_elems[7]._1_3_;
    local_118.m_backend.data._M_elems._24_5_ = local_3d8.data._M_elems._24_5_;
    local_118.m_backend.data._M_elems[0] = local_3d8.data._M_elems[0];
    local_118.m_backend.data._M_elems[1] = local_3d8.data._M_elems[1];
    local_118.m_backend.data._M_elems[2] = local_3d8.data._M_elems[2];
    local_118.m_backend.data._M_elems[3] = local_3d8.data._M_elems[3];
    local_118.m_backend.data._M_elems[4] = local_3d8.data._M_elems[4];
    local_118.m_backend.data._M_elems[5] = local_3d8.data._M_elems[5];
    local_118.m_backend.data._M_elems[9]._1_3_ = local_3d8.data._M_elems[9]._1_3_;
    local_118.m_backend.data._M_elems._32_5_ = local_3d8.data._M_elems._32_5_;
    local_118.m_backend.exp = local_3d8.exp;
    local_118.m_backend.neg = local_3d8.neg;
    local_118.m_backend.fpclass = local_3d8.fpclass;
    local_118.m_backend.prec_elem = local_3d8.prec_elem;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_118);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolBounds= ",0x10);
    local_158.m_backend.data._M_elems[7]._1_3_ = local_418.data._M_elems[7]._1_3_;
    local_158.m_backend.data._M_elems._24_5_ = local_418.data._M_elems._24_5_;
    local_158.m_backend.data._M_elems[0] = local_418.data._M_elems[0];
    local_158.m_backend.data._M_elems[1] = local_418.data._M_elems[1];
    local_158.m_backend.data._M_elems[2] = local_418.data._M_elems[2];
    local_158.m_backend.data._M_elems[3] = local_418.data._M_elems[3];
    local_158.m_backend.data._M_elems[4] = local_418.data._M_elems[4];
    local_158.m_backend.data._M_elems[5] = local_418.data._M_elems[5];
    local_158.m_backend.data._M_elems[9]._1_3_ = local_418.data._M_elems[9]._1_3_;
    local_158.m_backend.data._M_elems._32_5_ = local_418.data._M_elems._32_5_;
    local_158.m_backend.exp = local_418.exp;
    local_158.m_backend.neg = local_418.neg;
    local_158.m_backend.fpclass = local_418.fpclass;
    local_158.m_backend.prec_elem = local_418.prec_elem;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_158);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolConst= ",0xf);
    local_198.m_backend.data._M_elems[7]._1_3_ = local_458.data._M_elems[7]._1_3_;
    local_198.m_backend.data._M_elems._24_5_ = local_458.data._M_elems._24_5_;
    local_198.m_backend.data._M_elems[0] = local_458.data._M_elems[0];
    local_198.m_backend.data._M_elems[1] = local_458.data._M_elems[1];
    local_198.m_backend.data._M_elems[2] = local_458.data._M_elems[2];
    local_198.m_backend.data._M_elems[3] = local_458.data._M_elems[3];
    local_198.m_backend.data._M_elems[4] = local_458.data._M_elems[4];
    local_198.m_backend.data._M_elems[5] = local_458.data._M_elems[5];
    local_198.m_backend.data._M_elems[9]._1_3_ = local_458.data._M_elems[9]._1_3_;
    local_198.m_backend.data._M_elems._32_5_ = local_458.data._M_elems._32_5_;
    local_198.m_backend.exp = local_458.exp;
    local_198.m_backend.neg = local_458.neg;
    local_198.m_backend.fpclass = local_458.fpclass;
    local_198.m_backend.prec_elem = local_458.prec_elem;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_198);
    cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolRedCost= ",0x11);
    local_1d8.m_backend.data._M_elems[7]._1_3_ = uStack_2fb;
    local_1d8.m_backend.data._M_elems._24_5_ = uStack_300;
    local_1d8.m_backend.data._M_elems[0] = local_318[0];
    local_1d8.m_backend.data._M_elems[1] = local_318[1];
    local_1d8.m_backend.data._M_elems[2] = local_318[2];
    local_1d8.m_backend.data._M_elems[3] = local_318[3];
    local_1d8.m_backend.data._M_elems[4] = local_318[4];
    local_1d8.m_backend.data._M_elems[5] = local_318[5];
    local_1d8.m_backend.data._M_elems[9]._1_3_ = uStack_2f3;
    local_1d8.m_backend.data._M_elems._32_5_ = local_2f8;
    local_1d8.m_backend.exp = local_2f0;
    local_1d8.m_backend.neg = (bool)local_2ec;
    local_1d8.m_backend.fpclass = (fpclass_type)local_2e8;
    local_1d8.m_backend.prec_elem = local_2e8._4_4_;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolBounds= ",0x10);
    local_218.m_backend.data._M_elems[7]._1_3_ = uStack_33b;
    local_218.m_backend.data._M_elems._24_5_ = uStack_340;
    local_218.m_backend.data._M_elems[0] = local_358[0];
    local_218.m_backend.data._M_elems[1] = local_358[1];
    local_218.m_backend.data._M_elems[2] = local_358[2];
    local_218.m_backend.data._M_elems[3] = local_358[3];
    local_218.m_backend.data._M_elems[4] = local_358[4];
    local_218.m_backend.data._M_elems[5] = local_358[5];
    local_218.m_backend.data._M_elems[9]._1_3_ = uStack_333;
    local_218.m_backend.data._M_elems._32_5_ = local_338;
    local_218.m_backend.exp = local_330;
    local_218.m_backend.neg = (bool)local_32c;
    local_218.m_backend.fpclass = (fpclass_type)local_328;
    local_218.m_backend.prec_elem = local_328._4_4_;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolConst= ",0xf);
    local_258.m_backend.data._M_elems[7]._1_3_ = uStack_37b;
    local_258.m_backend.data._M_elems._24_5_ = uStack_380;
    local_258.m_backend.data._M_elems[0] = local_398[0];
    local_258.m_backend.data._M_elems[1] = local_398[1];
    local_258.m_backend.data._M_elems[2] = local_398[2];
    local_258.m_backend.data._M_elems[3] = local_398[3];
    local_258.m_backend.data._M_elems[4] = local_398[4];
    local_258.m_backend.data._M_elems[5] = local_398[5];
    local_258.m_backend.data._M_elems[9]._1_3_ = uStack_373;
    local_258.m_backend.data._M_elems._32_5_ = local_378;
    local_258.m_backend.exp = local_370;
    local_258.m_backend.neg = (bool)local_36c;
    local_258.m_backend.fpclass = (fpclass_type)local_368;
    local_258.m_backend.prec_elem = local_368._4_4_;
    boost::multiprecision::operator<<(pSVar1->m_streams[pSVar1->m_verbosity],&local_258);
    cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_2d8);
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}